

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeNEONModImmInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint uVar3;
  
  uVar3 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  if ((Insn & 0x40) != 0) {
    uVar1 = 0;
    if ((Insn >> 0xc & 1) == 0) {
      MCOperand_CreateReg0(Inst,(uint)*(ushort *)((long)QPRDecoderTable + (ulong)uVar3));
      uVar1 = 3;
    }
    DVar2 = (*(code *)((long)&DAT_001d4970 + (long)(int)(&DAT_001d4970)[uVar1]))();
    return DVar2;
  }
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar3]);
  MCOperand_CreateImm0
            (Inst,(ulong)(Insn & 0xf0f | Insn >> 0xc & 0x70 | Insn >> 0x11 & 0x80 |
                         (Insn & 0x20) << 7));
  uVar1 = MCInst_getOpcode(Inst);
  if ((int)uVar1 < 0x5a2) {
    if (1 < uVar1 - 599) {
      if (1 < uVar1 - 0x259) {
        return MCDisassembler_Success;
      }
LAB_00152e2b:
      uVar1 = 0;
      if ((Insn >> 0xc & 1) == 0) {
        MCOperand_CreateReg0(Inst,(uint)*(ushort *)((long)QPRDecoderTable + (ulong)uVar3));
        uVar1 = 3;
      }
      DVar2 = (*(code *)((long)&DAT_001d4980 + (long)(int)(&DAT_001d4980)[uVar1]))();
      return DVar2;
    }
  }
  else {
    if (uVar1 - 0x5a4 < 2) goto LAB_00152e2b;
    if (1 < uVar1 - 0x5a2) {
      return MCDisassembler_Success;
    }
  }
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar3]);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeNEONModImmInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned imm, Q;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	imm = fieldFromInstruction_4(Insn, 0, 4);
	imm |= fieldFromInstruction_4(Insn, 16, 3) << 4;
	imm |= fieldFromInstruction_4(Insn, 24, 1) << 7;
	imm |= fieldFromInstruction_4(Insn, 8, 4) << 8;
	imm |= fieldFromInstruction_4(Insn, 5, 1) << 12;
	Q = fieldFromInstruction_4(Insn, 6, 1);

	if (Q) {
		if (!Check(&S, DecodeQPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;
	} else {
		if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	MCOperand_CreateImm0(Inst, imm);

	switch (MCInst_getOpcode(Inst)) {
		case ARM_VORRiv4i16:
		case ARM_VORRiv2i32:
		case ARM_VBICiv4i16:
		case ARM_VBICiv2i32:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VORRiv8i16:
		case ARM_VORRiv4i32:
		case ARM_VBICiv8i16:
		case ARM_VBICiv4i32:
			if (!Check(&S, DecodeQPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	return S;
}